

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_msb.hpp
# Opt level: O3

uint32_t ans_msb_undo_mapping(uint32_t x)

{
  if (x < 0x101) {
    return x;
  }
  if (x < 0x201) {
    return x * 0x100 - 0x10000;
  }
  if (x < 0x301) {
    return x * 0x10000 + 0xfe000000;
  }
  return x << 0x18;
}

Assistant:

uint32_t ans_msb_undo_mapping(uint32_t x)
{
    if (x <= 256)
        return x;
    if (x <= 512)
        return ((x - 256) << 8);
    if (x <= 768)
        return ((x - 512) << 16);
    return ((x - 768) << 24);
}